

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblebridgeutils.cpp
# Opt level: O2

bool QAccessibleBridgeUtils::performEffectiveAction(QAccessibleInterface *iface,QString *actionName)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QString *pQVar4;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  bool success;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  long *plVar3;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (iface != (QAccessibleInterface *)0x0) {
    iVar2 = (*iface->_vptr_QAccessibleInterface[0x14])(iface,3);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(&local_58,plVar3);
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)local_58.data,actionName,CaseSensitive);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
      if (bVar1) {
        (**(code **)(*plVar3 + 0x28))(plVar3,actionName);
        bVar1 = true;
        goto LAB_004f9fe9;
      }
    }
    pQVar4 = QAccessibleActionInterface::increaseAction();
    bVar1 = ::operator!=(actionName,pQVar4);
    if (bVar1) {
      pQVar4 = QAccessibleActionInterface::decreaseAction();
      bVar1 = ::operator!=(actionName,pQVar4);
      if (bVar1) goto LAB_004f9f4a;
    }
    iVar2 = (*iface->_vptr_QAccessibleInterface[0x14])(iface,2);
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
    if (plVar3 != (long *)0x0) {
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      (**(code **)(*plVar3 + 0x10))(&local_58,plVar3);
      (**(code **)(*plVar3 + 0x30))(&local_78,plVar3);
      ::QVariant::toDouble((bool *)&local_78);
      ::QVariant::~QVariant(&local_78);
      (**(code **)(*plVar3 + 0x28))(&local_78,plVar3);
      ::QVariant::toDouble((bool *)&local_78);
      ::QVariant::~QVariant(&local_78);
      bVar1 = false;
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_004f9fe9;
    }
  }
LAB_004f9f4a:
  bVar1 = false;
LAB_004f9fe9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool performEffectiveAction(QAccessibleInterface *iface, const QString &actionName)
{
    if (!iface)
        return false;
    if (performAction(iface, actionName))
        return true;
    if (actionName != QAccessibleActionInterface::increaseAction()
        && actionName != QAccessibleActionInterface::decreaseAction())
        return false;

    QAccessibleValueInterface *valueIface = iface->valueInterface();
    if (!valueIface)
        return false;
    bool success;
    const QVariant currentVariant = valueIface->currentValue();
    double stepSize = valueIface->minimumStepSize().toDouble(&success);
    if (!success || qFuzzyIsNull(stepSize)) {
        const double min = valueIface->minimumValue().toDouble(&success);
        if (!success)
            return false;
        const double max = valueIface->maximumValue().toDouble(&success);
        if (!success)
            return false;
        stepSize = (max - min) / 10;  // this is pretty arbitrary, we just need to provide something
        const int typ = currentVariant.userType();
        if (typ != QMetaType::Float && typ != QMetaType::Double) {
            // currentValue is an integer. Round it up to ensure stepping in case it was below 1
            stepSize = qCeil(stepSize);
        }
    }
    const double current = currentVariant.toDouble(&success);
    if (!success)
        return false;
    if (actionName == QAccessibleActionInterface::decreaseAction())
        stepSize = -stepSize;
    valueIface->setCurrentValue(current + stepSize);
    return true;
}